

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>::
AdapterPromiseNode<kj::TimerImpl::Impl&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>
          (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter> *this,Impl *params,
          Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *params_1)

{
  Impl *impl;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *pAVar1;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *params_local_1;
  Impl *params_local;
  AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<void>::PromiseFulfiller((PromiseFulfiller<void> *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_007dda08;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_007dda50;
  ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)(this + 0x18));
  this[0x180] = (AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>)0x1;
  impl = fwd<kj::TimerImpl::Impl&>(params);
  pAVar1 = fwd<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>(params_1);
  TimerImpl::TimerPromiseAdapter::TimerPromiseAdapter
            ((TimerPromiseAdapter *)(this + 0x188),(PromiseFulfiller<void> *)(this + 0x10),impl,
             (TimePoint)(pAVar1->value).value);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}